

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_s32__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  size_t i;
  ulong samplesToRead_00;
  drwav_uint64 dVar2;
  drwav_uint64 dVar3;
  drwav_uint64 dVar4;
  uint uVar5;
  uchar sampleData [4096];
  double local_1038 [513];
  
  uVar1 = pWav->bitsPerSample;
  if ((uVar1 < 8) || ((uVar1 & 7) != 0)) {
    uVar5 = (uint)(pWav->fmt).blockAlign / (uint)(pWav->fmt).channels;
  }
  else {
    uVar5 = (uint)(uVar1 >> 3);
  }
  dVar4 = 0;
  if (uVar5 != 0) {
    do {
      if (samplesToRead == 0) {
        return dVar4;
      }
      samplesToRead_00 = 0x1000 / (ulong)uVar5;
      if (samplesToRead < 0x1000 / (ulong)uVar5) {
        samplesToRead_00 = samplesToRead;
      }
      dVar2 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar2 != 0) {
        if (uVar5 == 8) {
          if (pBufferOut != (drwav_int32 *)0x0) {
            dVar3 = 0;
            do {
              pBufferOut[dVar3] = (int)(local_1038[dVar3] * 2147483648.0);
              dVar3 = dVar3 + 1;
            } while (dVar2 != dVar3);
          }
        }
        else if (uVar5 == 4) {
          if (pBufferOut != (drwav_int32 *)0x0) {
            dVar3 = 0;
            do {
              pBufferOut[dVar3] = (int)(*(float *)((long)local_1038 + dVar3 * 4) * 2.1474836e+09);
              dVar3 = dVar3 + 1;
            } while (dVar2 != dVar3);
          }
        }
        else {
          memset(pBufferOut,0,dVar2 * 4);
        }
        pBufferOut = pBufferOut + dVar2;
        samplesToRead = samplesToRead - dVar2;
        dVar4 = dVar4 + dVar2;
      }
    } while (dVar2 != 0);
  }
  return dVar4;
}

Assistant:

drwav_uint64 drwav_read_s32__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s32(pBufferOut, sampleData, (size_t)samplesRead, bytesPerSample);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}